

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

mpack_tag_t mpack_read_tag(mpack_reader_t *reader)

{
  size_t sVar1;
  mpack_tag_t mVar2;
  mpack_tag_t tag;
  anon_union_8_8_6320e492_for_v local_18;
  ulong uStack_10;
  
  if (reader->error != mpack_ok) {
    return (mpack_tag_t)(ZEXT816(1) << 0x40);
  }
  local_18.u = 0;
  uStack_10 = 0;
  sVar1 = mpack_parse_tag(reader,(mpack_tag_t *)&local_18.ext);
  if (sVar1 == 0) {
    uStack_10 = 1;
    local_18.u = 0;
  }
  else {
    reader->data = reader->data + sVar1;
    uStack_10 = uStack_10 & 0xffffffff;
  }
  mVar2._8_8_ = uStack_10;
  mVar2.v.u = local_18.u;
  return mVar2;
}

Assistant:

mpack_tag_t mpack_read_tag(mpack_reader_t* reader) {
    mpack_log("reading tag\n");

    // make sure we can read a tag
    if (mpack_reader_error(reader) != mpack_ok)
        return mpack_tag_nil();
    if (mpack_reader_track_element(reader) != mpack_ok)
        return mpack_tag_nil();

    mpack_tag_t tag = MPACK_TAG_ZERO;
    size_t count = mpack_parse_tag(reader, &tag);
    if (count == 0)
        return mpack_tag_nil();

    #if MPACK_READ_TRACKING
    mpack_error_t track_error = mpack_ok;

    switch (tag.type) {
        case mpack_type_map:
        case mpack_type_array:
            track_error = mpack_track_push(&reader->track, tag.type, tag.v.l);
            break;
        case mpack_type_str:
        case mpack_type_bin:
            track_error = mpack_track_push(&reader->track, tag.type, tag.v.n);
            break;
        case mpack_type_ext:
            track_error = mpack_track_push(&reader->track, tag.type, tag.v.ext.length);
            break;
        default:
            break;
    }

    if (track_error != mpack_ok) {
        mpack_reader_flag_error(reader, track_error);
        return mpack_tag_nil();
    }
    #endif

    reader->data += count;
    return tag;
}